

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_stop_here.cpp
# Opt level: O0

void sc_core::sc_interrupt_here(char *id,sc_severity severity)

{
  sc_severity severity_local;
  char *id_local;
  
  switch(severity) {
  case SC_INFO:
    info_id = id;
    break;
  case SC_WARNING:
    warning_id = id;
    break;
  case SC_ERROR:
    error_id = id;
    break;
  default:
    fatal_id = id;
  }
  return;
}

Assistant:

void
sc_interrupt_here( const char* id, sc_severity severity )
{
    // you can set a breakpoint at some of the lines below, either to
    // interrupt with any severity, or to interrupt with a specific severity

    switch( severity ) {
      case SC_INFO: 
	info_id = id;
	break;
      case SC_WARNING: 
	warning_id = id;
	break;
      case SC_ERROR: 
	error_id = id;
	break;
      default:
      case SC_FATAL: 
	fatal_id = id;
	break;
    }
}